

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_char_geq(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  string error;
  string t;
  operand local_8c [3];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  psVar1 = label;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  label_to_string_abi_cxx11_(&local_40,psVar1,in_RDX);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_80,psVar1,lab);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_),
                      local_80.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p._0_4_ = 5;
    local_8c[0] = R11;
    local_8c[1] = 0x39;
    local_8c[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
    local_80._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_80,&local_60);
    local_80._M_dataplus._M_p._0_4_ = 0x40;
    local_8c[0] = R11;
    local_8c[1] = 0xb;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_80,local_8c,local_8c + 1);
    local_80._M_dataplus._M_p._0_4_ = 2;
    local_8c[0] = R11;
    local_8c[1] = 0x39;
    local_8c[2] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
    local_80._M_dataplus._M_p._0_4_ = 5;
    local_8c[0] = R11;
    local_8c[1] = 0x39;
    local_8c[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
    local_80._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_80,&local_60);
    local_80._M_dataplus._M_p._0_4_ = 0x40;
    local_8c[0] = R11;
    local_8c[1] = 0xc;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_80,local_8c,local_8c + 1);
    local_80._M_dataplus._M_p._0_4_ = 2;
    local_8c[0] = R11;
    local_8c[1] = 0x39;
    local_8c[2] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
    local_80._M_dataplus._M_p._0_4_ = 5;
    local_8c[0] = R11;
    local_8c[1] = 0x39;
    local_8c[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
    local_80._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_80,&local_60);
  }
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = RCX;
  local_8c[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,local_8c + 1);
  local_80._M_dataplus._M_p._0_4_ = 0x3c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_40);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = RAX;
  local_8c[1] = 0x39;
  local_8c[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x2c;
  local_8c[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c);
  local_80._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_40);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = RAX;
  local_8c[1] = 0x39;
  local_8c[2] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x2c;
  local_8c[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c);
  if (ops->safe_primitives == true) {
    error_label(code,&local_60,re_char_geq_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_char_geq(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string t = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RCX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::CMP, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::JGES, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_char_geq_contract_violation);
    }
  }